

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O1

void __thiscall Assimp::XFileParser::ParseDataObjectMeshVertexColors(XFileParser *this,Mesh *pMesh)

{
  pointer paVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  aiColor4D aVar8;
  string local_50;
  
  readHeadOfDataObject(this,(string *)0x0);
  uVar3 = pMesh->mNumColorSets;
  uVar4 = uVar3 + 1;
  if (8 < uVar4) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Too many colorsets","");
    ThrowException(this,&local_50);
  }
  pMesh->mNumColorSets = uVar4;
  uVar4 = ReadInt(this);
  if (((long)(pMesh->mPositions).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(pMesh->mPositions).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 - (ulong)uVar4 != 0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Vertex color count does not match vertex count","");
    ThrowException(this,&local_50);
  }
  local_50._M_dataplus._M_p = (pointer)0x0;
  local_50._M_string_length = 0x3f80000000000000;
  std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::resize
            (pMesh->mColors + uVar3,(ulong)uVar4,(value_type *)&local_50);
  while( true ) {
    if (uVar4 == 0) {
      CheckForClosingBrace(this);
      return;
    }
    uVar5 = ReadInt(this);
    uVar7 = (ulong)uVar5;
    uVar6 = ((long)(pMesh->mPositions).
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pMesh->mPositions).
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
    if (uVar6 < uVar7 || uVar6 - uVar7 == 0) break;
    aVar8 = ReadRGBA(this);
    paVar1 = pMesh->mColors[uVar3].
             super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
             super__Vector_impl_data._M_start + uVar7;
    paVar1->r = aVar8.r;
    paVar1->g = aVar8.g;
    paVar1->b = aVar8.b;
    paVar1->a = aVar8.a;
    if (this->mIsBinaryFormat == false) {
      FindNextNoneWhiteSpace(this);
      cVar2 = *this->mP;
      if ((cVar2 == ';') || (cVar2 == ',')) {
        this->mP = this->mP + 1;
      }
    }
    uVar4 = uVar4 - 1;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Vertex color index out of bounds","");
  ThrowException(this,&local_50);
}

Assistant:

void XFileParser::ParseDataObjectMeshVertexColors( Mesh* pMesh)
{
    readHeadOfDataObject();
    if( pMesh->mNumColorSets + 1 > AI_MAX_NUMBER_OF_COLOR_SETS)
        ThrowException( "Too many colorsets");
    std::vector<aiColor4D>& colors = pMesh->mColors[pMesh->mNumColorSets++];

    unsigned int numColors = ReadInt();
    if( numColors != pMesh->mPositions.size())
        ThrowException( "Vertex color count does not match vertex count");

    colors.resize( numColors, aiColor4D( 0, 0, 0, 1));
    for( unsigned int a = 0; a < numColors; a++)
    {
        unsigned int index = ReadInt();
        if( index >= pMesh->mPositions.size())
            ThrowException( "Vertex color index out of bounds");

        colors[index] = ReadRGBA();
        // HACK: (thom) Maxon Cinema XPort plugin puts a third separator here, kwxPort puts a comma.
        // Ignore gracefully.
        if( !mIsBinaryFormat)
        {
            FindNextNoneWhiteSpace();
            if( *mP == ';' || *mP == ',')
                mP++;
        }
    }

    CheckForClosingBrace();
}